

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O2

bool pop_up_ask_type_location
               (int old_left,int old_top,int old_width,int old_height,int left_control,
               int top_control,int width_control,int height_control,int *ask_left,int *ask_top,
               int *ask_width,int *ask_height)

{
  ostream *poVar1;
  
  if (am_sdebug) {
    poVar1 = std::operator<<((ostream *)&std::cout,"**** Ask user to type location ");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::ostream::flush();
  }
  if (left_control == 0x66) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Left (old=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,old_left);
    std::operator<<(poVar1,"): ");
    std::ostream::flush();
    std::istream::operator>>((istream *)&std::cin,ask_left);
  }
  if (top_control == 0x66) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Top (old=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,old_top);
    std::operator<<(poVar1,"): ");
    std::ostream::flush();
    std::istream::operator>>((istream *)&std::cin,ask_top);
  }
  if (width_control == 0x66) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Width (old=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,old_width);
    std::operator<<(poVar1,"): ");
    std::ostream::flush();
    std::istream::operator>>((istream *)&std::cin,ask_width);
  }
  if (height_control == 0x66) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Height (old=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,old_height);
    std::operator<<(poVar1,"): ");
    std::ostream::flush();
    std::istream::operator>>((istream *)&std::cin,ask_height);
  }
  return true;
}

Assistant:

bool
pop_up_ask_type_location(int old_left, int old_top, int old_width,
                         int old_height, int left_control, int top_control,
                         int width_control, int height_control, int &ask_left,
                         int &ask_top, int &ask_width, int &ask_height)
{
  if (am_sdebug)
    std::cout << "**** Ask user to type location " << std::endl << std::flush;
  //** if value typed is a list, then just use the next value next time **//
  if (left_control == am_ask_user_type) {
    std::cout << "Left (old=" << old_left << "): " << std::flush;
    std::cin >> ask_left;
  }
  if (top_control == am_ask_user_type) {
    std::cout << "Top (old=" << old_top << "): " << std::flush;
    std::cin >> ask_top;
  }
  if (width_control == am_ask_user_type) {
    std::cout << "Width (old=" << old_width << "): " << std::flush;
    std::cin >> ask_width;
  }
  if (height_control == am_ask_user_type) {
    std::cout << "Height (old=" << old_height << "): " << std::flush;
    std::cin >> ask_height;
  }

  return true;
}